

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O3

XML_Error appendAttributeValue
                    (XML_Parser parser,ENCODING *enc,XML_Bool isCdata,char *ptr,char *end,
                    STRING_POOL *pool)

{
  char cVar1;
  char *ptr_00;
  DTD *pDVar2;
  XML_Bool XVar3;
  int iVar4;
  uint uVar5;
  XML_Error XVar6;
  char *pcVar7;
  XML_Char *pXVar8;
  NAMED *pNVar9;
  undefined7 in_register_00000011;
  ulong uVar10;
  ulong uVar11;
  char *next;
  XML_Char buf [4];
  char *local_60;
  uint local_58;
  char local_54 [4];
  char *local_50;
  STRING_POOL *local_48;
  DTD *local_40;
  STRING_POOL *local_38;
  
  uVar10 = CONCAT71(in_register_00000011,isCdata) & 0xffffffff;
  local_40 = parser->m_dtd;
  local_38 = &parser->m_temp2Pool;
  local_48 = &local_40->pool;
LAB_00458c2f:
  pcVar7 = ptr;
  iVar4 = (*enc->literalScanners[0])(enc,pcVar7,end,&local_60);
  switch(iVar4) {
  case 0:
    if (parser->m_encoding == enc) {
      parser->m_eventPtr = local_60;
      return XML_ERROR_INVALID_TOKEN;
    }
    return XML_ERROR_INVALID_TOKEN;
  case 6:
    pXVar8 = poolAppend(pool,enc,pcVar7,local_60);
    ptr = local_60;
    if (pXVar8 == (XML_Char *)0x0) {
      return XML_ERROR_NO_MEMORY;
    }
    goto LAB_00458c2f;
  case 7:
    break;
  case 9:
    iVar4 = (*enc->predefinedEntityName)
                      (enc,pcVar7 + enc->minBytesPerChar,local_60 + -(long)enc->minBytesPerChar);
    if ((char)iVar4 == '\0') {
      pXVar8 = poolStoreString(local_38,enc,pcVar7 + enc->minBytesPerChar,
                               local_60 + -(long)enc->minBytesPerChar);
      pDVar2 = local_40;
      if (pXVar8 == (XML_Char *)0x0) {
        return XML_ERROR_NO_MEMORY;
      }
      local_58 = (uint)uVar10;
      local_50 = end;
      pNVar9 = lookup(parser,&local_40->generalEntities,pXVar8,0);
      end = local_50;
      (parser->m_temp2Pool).ptr = (parser->m_temp2Pool).start;
      if (local_48 == pool) {
        if (pDVar2->standalone == '\0') {
          if (pDVar2->hasParamEntityRefs != '\0') goto LAB_00458e6c;
          goto LAB_00458e37;
        }
        if (parser->m_openInternalEntities == (OPEN_INTERNAL_ENTITY *)0x0) goto LAB_00458e37;
LAB_00458e6c:
        uVar10 = (ulong)local_58;
        ptr = local_60;
        if (pNVar9 == (NAMED *)0x0) goto LAB_00458c2f;
      }
      else {
        if ((pDVar2->hasParamEntityRefs != '\0') && (pDVar2->standalone == '\0')) goto LAB_00458e6c;
LAB_00458e37:
        if (pNVar9 == (NAMED *)0x0) {
          return XML_ERROR_UNDEFINED_ENTITY;
        }
        if (*(char *)((long)&pNVar9[7].name + 2) == '\0') {
          return XML_ERROR_ENTITY_DECLARED_IN_PE;
        }
      }
      uVar10 = (ulong)local_58;
      if (*(char *)&pNVar9[7].name != '\0') {
        XVar6 = XML_ERROR_RECURSIVE_ENTITY_REF;
        goto LAB_00458f32;
      }
      if (pNVar9[6].name != (KEY)0x0) {
        XVar6 = XML_ERROR_BINARY_ENTITY_REF;
        goto LAB_00458f32;
      }
      ptr_00 = pNVar9[1].name;
      if (ptr_00 == (char *)0x0) {
        XVar6 = XML_ERROR_ATTRIBUTE_EXTERNAL_ENTITY_REF;
        goto LAB_00458f32;
      }
      *(undefined1 *)&pNVar9[7].name = 1;
      XVar6 = appendAttributeValue
                        (parser,parser->m_internalEncoding,(XML_Bool)local_58,ptr_00,
                         ptr_00 + *(int *)&pNVar9[2].name,pool);
      *(undefined1 *)&pNVar9[7].name = 0;
      ptr = local_60;
      if (XVar6 != XML_ERROR_NONE) {
        return XVar6;
      }
    }
    else {
      pcVar7 = pool->ptr;
      if (pcVar7 == pool->end) {
        XVar3 = poolGrow(pool);
        if (XVar3 == '\0') {
          return XML_ERROR_NO_MEMORY;
        }
        pcVar7 = pool->ptr;
      }
      pool->ptr = pcVar7 + 1;
      *pcVar7 = (char)iVar4;
      ptr = local_60;
    }
    goto LAB_00458c2f;
  case 10:
    iVar4 = (*enc->charRefNumber)(enc,pcVar7);
    if (iVar4 < 0) {
      XVar6 = XML_ERROR_BAD_CHAR_REF;
LAB_00458f32:
      if (parser->m_encoding == enc) {
        parser->m_eventPtr = pcVar7;
        return XVar6;
      }
      return XVar6;
    }
    if (((iVar4 != 0x20 || (char)uVar10 != '\0') ||
        ((ptr = local_60, pool->ptr != pool->start && (ptr = local_60, pool->ptr[-1] != ' ')))) &&
       (uVar5 = XmlUtf8Encode(iVar4,local_54), ptr = local_60, 0 < (int)uVar5)) {
      uVar11 = 0;
      do {
        pcVar7 = pool->ptr;
        if (pcVar7 == pool->end) {
          XVar3 = poolGrow(pool);
          if (XVar3 == '\0') {
            return XML_ERROR_NO_MEMORY;
          }
          pcVar7 = pool->ptr;
        }
        cVar1 = local_54[uVar11];
        pool->ptr = pcVar7 + 1;
        *pcVar7 = cVar1;
        uVar11 = uVar11 + 1;
        ptr = local_60;
      } while (uVar5 != uVar11);
    }
    goto LAB_00458c2f;
  case -4:
    return XML_ERROR_NONE;
  case -3:
    local_60 = pcVar7 + enc->minBytesPerChar;
    break;
  case -2:
  case 1:
  case 2:
  case 3:
  case 4:
  case 5:
  case 8:
switchD_00458c57_caseD_fffffffe:
    XVar6 = XML_ERROR_UNEXPECTED_STATE;
    goto LAB_00458f32;
  case -1:
    XVar6 = XML_ERROR_INVALID_TOKEN;
    goto LAB_00458f32;
  default:
    if (iVar4 != 0x27) goto switchD_00458c57_caseD_fffffffe;
  }
  pXVar8 = pool->ptr;
  if (((char)uVar10 != '\0') ||
     ((ptr = local_60, pXVar8 != pool->start && (ptr = local_60, pXVar8[-1] != ' ')))) {
    if (pXVar8 == pool->end) {
      XVar3 = poolGrow(pool);
      if (XVar3 == '\0') {
        return XML_ERROR_NO_MEMORY;
      }
      pXVar8 = pool->ptr;
    }
    pool->ptr = pXVar8 + 1;
    *pXVar8 = ' ';
    ptr = local_60;
  }
  goto LAB_00458c2f;
}

Assistant:

static enum XML_Error
appendAttributeValue(XML_Parser parser, const ENCODING *enc, XML_Bool isCdata,
                     const char *ptr, const char *end,
                     STRING_POOL *pool)
{
  DTD * const dtd = parser->m_dtd;  /* save one level of indirection */
  for (;;) {
    const char *next;
    int tok = XmlAttributeValueTok(enc, ptr, end, &next);
    switch (tok) {
    case XML_TOK_NONE:
      return XML_ERROR_NONE;
    case XML_TOK_INVALID:
      if (enc == parser->m_encoding)
        parser->m_eventPtr = next;
      return XML_ERROR_INVALID_TOKEN;
    case XML_TOK_PARTIAL:
      if (enc == parser->m_encoding)
        parser->m_eventPtr = ptr;
      return XML_ERROR_INVALID_TOKEN;
    case XML_TOK_CHAR_REF:
      {
        XML_Char buf[XML_ENCODE_MAX];
        int i;
        int n = XmlCharRefNumber(enc, ptr);
        if (n < 0) {
          if (enc == parser->m_encoding)
            parser->m_eventPtr = ptr;
          return XML_ERROR_BAD_CHAR_REF;
        }
        if (!isCdata
            && n == 0x20 /* space */
            && (poolLength(pool) == 0 || poolLastChar(pool) == 0x20))
          break;
        n = XmlEncode(n, (ICHAR *)buf);
        /* The XmlEncode() functions can never return 0 here.  That
         * error return happens if the code point passed in is either
         * negative or greater than or equal to 0x110000.  The
         * XmlCharRefNumber() functions will all return a number
         * strictly less than 0x110000 or a negative value if an error
         * occurred.  The negative value is intercepted above, so
         * XmlEncode() is never passed a value it might return an
         * error for.
         */
        for (i = 0; i < n; i++) {
          if (!poolAppendChar(pool, buf[i]))
            return XML_ERROR_NO_MEMORY;
        }
      }
      break;
    case XML_TOK_DATA_CHARS:
      if (!poolAppend(pool, enc, ptr, next))
        return XML_ERROR_NO_MEMORY;
      break;
    case XML_TOK_TRAILING_CR:
      next = ptr + enc->minBytesPerChar;
      /* fall through */
    case XML_TOK_ATTRIBUTE_VALUE_S:
    case XML_TOK_DATA_NEWLINE:
      if (!isCdata && (poolLength(pool) == 0 || poolLastChar(pool) == 0x20))
        break;
      if (!poolAppendChar(pool, 0x20))
        return XML_ERROR_NO_MEMORY;
      break;
    case XML_TOK_ENTITY_REF:
      {
        const XML_Char *name;
        ENTITY *entity;
        char checkEntityDecl;
        XML_Char ch = (XML_Char) XmlPredefinedEntityName(enc,
                                              ptr + enc->minBytesPerChar,
                                              next - enc->minBytesPerChar);
        if (ch) {
          if (!poolAppendChar(pool, ch))
                return XML_ERROR_NO_MEMORY;
          break;
        }
        name = poolStoreString(&parser->m_temp2Pool, enc,
                               ptr + enc->minBytesPerChar,
                               next - enc->minBytesPerChar);
        if (!name)
          return XML_ERROR_NO_MEMORY;
        entity = (ENTITY *)lookup(parser, &dtd->generalEntities, name, 0);
        poolDiscard(&parser->m_temp2Pool);
        /* First, determine if a check for an existing declaration is needed;
           if yes, check that the entity exists, and that it is internal.
        */
        if (pool == &dtd->pool)  /* are we called from prolog? */
          checkEntityDecl =
#ifdef XML_DTD
              parser->m_prologState.documentEntity &&
#endif /* XML_DTD */
              (dtd->standalone
               ? !parser->m_openInternalEntities
               : !dtd->hasParamEntityRefs);
        else /* if (pool == &parser->m_tempPool): we are called from content */
          checkEntityDecl = !dtd->hasParamEntityRefs || dtd->standalone;
        if (checkEntityDecl) {
          if (!entity)
            return XML_ERROR_UNDEFINED_ENTITY;
          else if (!entity->is_internal)
            return XML_ERROR_ENTITY_DECLARED_IN_PE;
        }
        else if (!entity) {
          /* Cannot report skipped entity here - see comments on
             parser->m_skippedEntityHandler.
          if (parser->m_skippedEntityHandler)
            parser->m_skippedEntityHandler(parser->m_handlerArg, name, 0);
          */
          /* Cannot call the default handler because this would be
             out of sync with the call to the startElementHandler.
          if ((pool == &parser->m_tempPool) && parser->m_defaultHandler)
            reportDefault(parser, enc, ptr, next);
          */
          break;
        }
        if (entity->open) {
          if (enc == parser->m_encoding) {
            /* It does not appear that this line can be executed.
             *
             * The "if (entity->open)" check catches recursive entity
             * definitions.  In order to be called with an open
             * entity, it must have gone through this code before and
             * been through the recursive call to
             * appendAttributeValue() some lines below.  That call
             * sets the local encoding ("enc") to the parser's
             * internal encoding (internal_utf8 or internal_utf16),
             * which can never be the same as the principle encoding.
             * It doesn't appear there is another code path that gets
             * here with entity->open being TRUE.
             *
             * Since it is not certain that this logic is watertight,
             * we keep the line and merely exclude it from coverage
             * tests.
             */
            parser->m_eventPtr = ptr; /* LCOV_EXCL_LINE */
          }
          return XML_ERROR_RECURSIVE_ENTITY_REF;
        }
        if (entity->notation) {
          if (enc == parser->m_encoding)
            parser->m_eventPtr = ptr;
          return XML_ERROR_BINARY_ENTITY_REF;
        }
        if (!entity->textPtr) {
          if (enc == parser->m_encoding)
            parser->m_eventPtr = ptr;
          return XML_ERROR_ATTRIBUTE_EXTERNAL_ENTITY_REF;
        }
        else {
          enum XML_Error result;
          const XML_Char *textEnd = entity->textPtr + entity->textLen;
          entity->open = XML_TRUE;
          result = appendAttributeValue(parser, parser->m_internalEncoding, isCdata,
                                        (char *)entity->textPtr,
                                        (char *)textEnd, pool);
          entity->open = XML_FALSE;
          if (result)
            return result;
        }
      }
      break;
    default:
      /* The only token returned by XmlAttributeValueTok() that does
       * not have an explicit case here is XML_TOK_PARTIAL_CHAR.
       * Getting that would require an entity name to contain an
       * incomplete XML character (e.g. \xE2\x82); however previous
       * tokenisers will have already recognised and rejected such
       * names before XmlAttributeValueTok() gets a look-in.  This
       * default case should be retained as a safety net, but the code
       * excluded from coverage tests.
       *
       * LCOV_EXCL_START
       */
      if (enc == parser->m_encoding)
        parser->m_eventPtr = ptr;
      return XML_ERROR_UNEXPECTED_STATE;
      /* LCOV_EXCL_STOP */
    }
    ptr = next;
  }
  /* not reached */
}